

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O1

int cuddWindowReorder(DdManager *table,int low,int high,Cudd_ReorderingType submethod)

{
  uint uVar1;
  undefined4 *puVar2;
  bool bVar3;
  bool bVar4;
  void *__ptr;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  iVar11 = 0;
  switch(submethod) {
  case CUDD_REORDER_WINDOW2:
    iVar11 = ddWindow2(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW3:
switchD_007edf36_caseD_9:
    iVar11 = ddWindow3(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW4:
    if (high - low < 3) goto switchD_007edf36_caseD_9;
    iVar11 = low + 2;
    while (iVar11 < high) {
      iVar11 = ddPermuteWindow4(table,low);
      if (iVar11 == 0) {
        return 0;
      }
      iVar11 = low + 3;
      low = low + 1;
    }
    break;
  case CUDD_REORDER_WINDOW2_CONV:
    iVar11 = ddWindowConv2(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW3_CONV:
switchD_007edf36_caseD_c:
    iVar11 = ddWindowConv3(table,low,high);
    return iVar11;
  case CUDD_REORDER_WINDOW4_CONV:
    iVar11 = high - low;
    if (iVar11 < 3) goto switchD_007edf36_caseD_c;
    uVar1 = iVar11 - 2;
    __ptr = malloc((ulong)uVar1 * 4);
    if (__ptr == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    uVar10 = 1;
    if (1 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    uVar5 = 0;
    do {
      *(undefined4 *)((long)__ptr + uVar5 * 4) = 1;
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
    lVar8 = (long)(iVar11 + -3);
    lVar9 = (long)(iVar11 + -5);
    lVar6 = (long)(iVar11 + -4);
    uVar5 = 0;
    bVar4 = false;
    do {
      do {
        bVar3 = bVar4;
        if (*(int *)((long)__ptr + uVar5 * 4) == 0) goto LAB_007ee0e3;
        iVar11 = ddPermuteWindow4(table,low + (int)uVar5);
        if (0x17 < iVar11 - 1U) {
          free(__ptr);
          return 0;
        }
        puVar2 = (undefined4 *)((long)__ptr + uVar5 * 4);
        switch(iVar11) {
        case 1:
          goto switchD_007ee079_caseD_1;
        case 2:
          if ((long)uVar5 < lVar6) {
            puVar2[2] = 1;
          }
          goto LAB_007ee1d1;
        case 3:
        case 5:
        case 10:
          if ((long)uVar5 < lVar6) {
            puVar2[2] = 1;
          }
          if ((long)uVar5 < lVar8) {
            puVar2[1] = 1;
          }
          goto LAB_007ee0b0;
        case 4:
        case 9:
        case 0xe:
          if ((long)uVar5 < lVar9) {
            puVar2[3] = 1;
          }
          if ((long)uVar5 < lVar6) {
            puVar2[2] = 1;
          }
          if (uVar5 != 0) {
            puVar2[-1] = 1;
          }
LAB_007ee1d1:
          bVar3 = true;
          lVar7 = -8;
          if (1 < uVar5) goto LAB_007ee0d0;
          goto switchD_007ee079_caseD_1;
        default:
          if ((long)uVar5 < lVar9) {
            puVar2[3] = 1;
          }
          if ((long)uVar5 < lVar6) {
            puVar2[2] = 1;
          }
          if ((long)uVar5 < lVar8) {
            puVar2[1] = 1;
          }
          if (uVar5 != 0) {
            puVar2[-1] = 1;
          }
LAB_007ee0b0:
          if (1 < uVar5) {
            puVar2[-2] = 1;
          }
          break;
        case 7:
          if ((long)uVar5 < lVar8) {
            puVar2[1] = 1;
          }
          break;
        case 8:
          if ((long)uVar5 < lVar9) {
            puVar2[3] = 1;
          }
          lVar7 = -4;
          if (uVar5 != 0) goto LAB_007ee0d0;
          goto LAB_007ee0d7;
        case 0xd:
          if ((long)uVar5 < lVar9) {
            puVar2[3] = 1;
          }
          if ((long)uVar5 < lVar8) {
            puVar2[1] = 1;
          }
          if (uVar5 != 0) {
            puVar2[-1] = 1;
          }
        }
        bVar3 = true;
        lVar7 = -0xc;
        if (2 < uVar5) {
LAB_007ee0d0:
          *(undefined4 *)((long)puVar2 + lVar7) = 1;
LAB_007ee0d7:
          bVar3 = true;
        }
switchD_007ee079_caseD_1:
        *puVar2 = 0;
LAB_007ee0e3:
        uVar5 = uVar5 + 1;
        bVar4 = bVar3;
      } while (uVar5 != uVar10);
      uVar5 = 0;
      bVar4 = false;
    } while (bVar3);
    free(__ptr);
    break;
  default:
    goto switchD_007edf36_default;
  }
  iVar11 = 1;
switchD_007edf36_default:
  return iVar11;
}

Assistant:

int
cuddWindowReorder(
  DdManager * table /* DD table */,
  int low /* lowest index to reorder */,
  int high /* highest index to reorder */,
  Cudd_ReorderingType submethod /* window reordering option */)
{

    int res;
#ifdef DD_DEBUG
    int supposedOpt;
#endif

    switch (submethod) {
    case CUDD_REORDER_WINDOW2:
        res = ddWindow2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3:
        res = ddWindow3(table,low,high);
        break;
    case CUDD_REORDER_WINDOW4:
        res = ddWindow4(table,low,high);
        break;
    case CUDD_REORDER_WINDOW2_CONV:
        res = ddWindowConv2(table,low,high);
        break;
    case CUDD_REORDER_WINDOW3_CONV:
        res = ddWindowConv3(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow3(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err, "Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    case CUDD_REORDER_WINDOW4_CONV:
        res = ddWindowConv4(table,low,high);
#ifdef DD_DEBUG
        supposedOpt = table->keys - table->isolated;
        res = ddWindow4(table,low,high);
        if (table->keys - table->isolated != (unsigned) supposedOpt) {
            (void) fprintf(table->err,"Convergence failed! (%d != %d)\n",
                           table->keys - table->isolated, supposedOpt);
        }
#endif
        break;
    default: return(0);
    }

    return(res);

}